

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_ImVec2_resizeT(ImVector_ImVec2 *self,int new_size,ImVec2 v)

{
  ImVec2 local_8;
  
  local_8 = v;
  ImVector<ImVec2>::resize(self,new_size,&local_8);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImVec2_resizeT(ImVector_ImVec2* self,int new_size,const ImVec2 v)
{
    return self->resize(new_size,v);
}